

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

bool __thiscall absl::lts_20250127::Cord::EndsWith(Cord *this,string_view rhs)

{
  string_view rhs_00;
  CordRep *pCVar1;
  undefined1 local_48 [8];
  Cord tmp;
  size_t rhs_size;
  size_t my_size;
  Cord *this_local;
  string_view rhs_local;
  
  rhs_local._M_len = (size_t)rhs._M_str;
  this_local = (Cord *)rhs._M_len;
  pCVar1 = (CordRep *)size(this);
  tmp.contents_.data_.rep_.field_0.as_tree.rep =
       (CordRep *)
       std::basic_string_view<char,_std::char_traits<char>_>::size
                 ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (pCVar1 < tmp.contents_.data_.rep_.field_0.as_tree.rep) {
    rhs_local._M_str._7_1_ = 0;
  }
  else {
    Cord((Cord *)local_48,this);
    RemovePrefix((Cord *)local_48,(long)pCVar1 - tmp.contents_.data_.rep_.field_0._8_8_);
    rhs_00._M_str = (char *)rhs_local._M_len;
    rhs_00._M_len = (size_t)this_local;
    rhs_local._M_str._7_1_ =
         EqualsImpl((Cord *)local_48,rhs_00,(size_t)tmp.contents_.data_.rep_.field_0.as_tree.rep);
    ~Cord((Cord *)local_48);
  }
  return (bool)(rhs_local._M_str._7_1_ & 1);
}

Assistant:

bool Cord::EndsWith(absl::string_view rhs) const {
  size_t my_size = size();
  size_t rhs_size = rhs.size();

  if (my_size < rhs_size) return false;

  Cord tmp(*this);
  tmp.RemovePrefix(my_size - rhs_size);
  return tmp.EqualsImpl(rhs, rhs_size);
}